

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall
FTypeTable::ReplaceType(FTypeTable *this,PType *newtype,PType *oldtype,size_t bucket)

{
  PType *pPVar1;
  PType **ppPVar2;
  PType **ppPVar3;
  
  ppPVar2 = this->TypeHash + bucket;
  do {
    ppPVar3 = ppPVar2;
    pPVar1 = *ppPVar3;
    if (pPVar1 == (PType *)0x0) {
      return;
    }
    ppPVar2 = &pPVar1->HashNext;
  } while (pPVar1 != oldtype);
  newtype->HashNext = *ppPVar2;
  *ppPVar2 = (PType *)0x0;
  *ppPVar3 = newtype;
  return;
}

Assistant:

void FTypeTable::ReplaceType(PType *newtype, PType *oldtype, size_t bucket)
{
	for (PType **type_p = &TypeHash[bucket]; *type_p != NULL; type_p = &(*type_p)->HashNext)
	{
		PType *type = *type_p;
		if (type == oldtype)
		{
			newtype->HashNext = type->HashNext;
			type->HashNext = NULL;
			*type_p = newtype;
			break;
		}
	}
}